

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O1

InOutVariable * inOutObject(InOutVariable *v)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  InOutVariable *in_RSI;
  long lVar5;
  BlockVariable *sv;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  undefined1 auVar10 [16];
  QLatin1String QVar11;
  QJsonArray arr;
  undefined1 local_78 [16];
  QString local_68;
  QJsonValue local_50 [24];
  int *local_38;
  
  local_38 = *(int **)(in_FS_OFFSET + 0x28);
  (v->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)v);
  QVar6.m_data = (storage_type *)(in_RSI->name).d.size;
  QVar6.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar6);
  QJsonValue::QJsonValue(local_50,&local_68);
  QVar7.m_data = (char *)0x4;
  QVar7.m_size = (qsizetype)v;
  local_78 = QJsonObject::operator[](QVar7);
  QJsonValueRef::operator=((QJsonValueRef *)local_78,local_50);
  QJsonValue::~QJsonValue(local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar5 = 0;
  lVar3 = 0;
  do {
    if (*(VariableType *)(typeTab[0].k + lVar3 + 0x14) == in_RSI->type) {
      pcVar4 = typeTab[0].k + lVar3;
      lVar5 = -1;
      pcVar2 = pcVar4;
      do {
        lVar5 = lVar5 + 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
      goto LAB_00473843;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x678);
  pcVar4 = (char *)0x0;
LAB_00473843:
  QVar11.m_data = pcVar4;
  QVar11.m_size = lVar5;
  QJsonValue::QJsonValue(local_50,QVar11);
  QVar8.m_data = (char *)0x4;
  QVar8.m_size = (qsizetype)v;
  local_68.d._0_16_ = QJsonObject::operator[](QVar8);
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,local_50);
  QJsonValue::~QJsonValue(local_50);
  addDeco((QJsonObject *)v,in_RSI);
  if ((in_RSI->structMembers).d.size != 0) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)local_78);
    lVar3 = (in_RSI->structMembers).d.size;
    if (lVar3 != 0) {
      lVar3 = lVar3 * 0x68;
      do {
        blockMemberObject((BlockVariable *)&local_68);
        QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_68);
        QJsonArray::append((QJsonValue *)local_78);
        QJsonValue::~QJsonValue(local_50);
        QJsonObject::~QJsonObject((QJsonObject *)&local_68);
        lVar3 = lVar3 + -0x68;
      } while (lVar3 != 0);
    }
    QJsonValue::QJsonValue(local_50,(QJsonArray *)local_78);
    QVar9.m_data = (char *)0xd;
    QVar9.m_size = (qsizetype)v;
    auVar10 = QJsonObject::operator[](QVar9);
    local_68.d._0_16_ = auVar10;
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray((QJsonArray *)local_78);
  }
  if (*(int **)(in_FS_OFFSET + 0x28) == local_38) {
    return v;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject inOutObject(const QShaderDescription::InOutVariable &v)
{
    QJsonObject obj;
    obj[nameKey()] = QString::fromUtf8(v.name);
    obj[typeKey()] = typeStr(v.type);
    addDeco(&obj, v);
    if (!v.structMembers.isEmpty()) {
        QJsonArray arr;
        for (const QShaderDescription::BlockVariable &sv : v.structMembers)
            arr.append(blockMemberObject(sv));
        obj[structMembersKey()] = arr;
    }
    return obj;
}